

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Importer.cpp
# Opt level: O1

aiNodeAnim * CreateNodeAnim(Asset *r,Node *node,AnimationSamplers *samplers)

{
  undefined8 *puVar1;
  Sampler *pSVar2;
  aiNodeAnim *paVar3;
  aiVectorKey *paVar4;
  aiQuatKey *paVar5;
  float *pfVar6;
  ulong uVar7;
  aiQuatKey *paVar8;
  uint uVar9;
  ulong uVar10;
  aiNodeAnim *paVar11;
  long lVar12;
  aiVector3D *values;
  float *times;
  aiQuaterniont<float> *local_60;
  float *local_58;
  ulong local_50;
  long local_48 [2];
  aiNodeAnim *local_38;
  
  paVar3 = (aiNodeAnim *)operator_new(0x438);
  (paVar3->mNodeName).length = 0;
  (paVar3->mNodeName).data[0] = '\0';
  memset((paVar3->mNodeName).data + 1,0x1b,0x3ff);
  paVar3->mRotationKeys = (aiQuatKey *)0x0;
  paVar3->mNumScalingKeys = 0;
  *(undefined8 *)&paVar3->mNumPositionKeys = 0;
  *(undefined8 *)((long)&paVar3->mPositionKeys + 4) = 0;
  paVar3->mScalingKeys = (aiVectorKey *)0x0;
  paVar3->mPreState = aiAnimBehaviour_DEFAULT;
  paVar3->mPostState = aiAnimBehaviour_DEFAULT;
  uVar10 = (ulong)((node->super_Object).name._M_string_length != 0);
  lVar12 = *(long *)((node->matrix).value + uVar10 * 8 + -0x1c);
  local_58 = (float *)local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,lVar12,
             *(long *)((node->matrix).value + uVar10 * 8 + -0x1a) + lVar12);
  if (local_50 < 0x400) {
    (paVar3->mNodeName).length = (ai_uint32)local_50;
    memcpy((paVar3->mNodeName).data,local_58,local_50);
    (paVar3->mNodeName).data[local_50] = '\0';
  }
  if (local_58 != (float *)local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  pSVar2 = samplers->translation;
  if (pSVar2 == (Sampler *)0x0) {
    paVar11 = paVar3;
    if ((node->translation).isPresent == true) {
      paVar3->mNumPositionKeys = 1;
      paVar4 = (aiVectorKey *)operator_new__(0x18);
      paVar4->mTime = 0.0;
      (paVar4->mValue).x = 0.0;
      (paVar4->mValue).y = 0.0;
      (paVar4->mValue).z = 0.0;
      paVar3->mPositionKeys = paVar4;
      paVar4->mTime = 0.0;
      (paVar4->mValue).x = (node->translation).value[0];
      (paVar4->mValue).y = (node->translation).value[1];
      (paVar4->mValue).z = (node->translation).value[2];
    }
  }
  else {
    local_58 = (float *)0x0;
    local_38 = paVar3;
    glTF2::Accessor::ExtractData<float>
              (*(Accessor **)
                ((long)(((pSVar2->input).vector)->
                       super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>).
                       _M_impl.super__Vector_impl_data._M_start + (ulong)(pSVar2->input).index * 8),
               &local_58);
    local_60 = (aiQuaterniont<float> *)0x0;
    glTF2::Accessor::ExtractData<aiVector3t<float>>
              ((((samplers->translation->output).vector)->
               super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>)._M_impl.
               super__Vector_impl_data._M_start[(samplers->translation->output).index],
               (aiVector3t<float> **)&local_60);
    uVar10 = *(ulong *)(*(long *)((long)(((samplers->translation->input).vector)->
                                        super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>
                                        )._M_impl.super__Vector_impl_data._M_start +
                                 (ulong)(samplers->translation->input).index * 8) + 0x70);
    uVar9 = (uint)uVar10;
    uVar10 = uVar10 & 0xffffffff;
    paVar3->mNumPositionKeys = uVar9;
    paVar4 = (aiVectorKey *)operator_new__(uVar10 * 0x18);
    if (uVar10 != 0) {
      uVar7 = 0;
      do {
        puVar1 = (undefined8 *)((long)&paVar4->mTime + uVar7);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined4 *)((long)&(paVar4->mValue).z + uVar7) = 0;
        uVar7 = uVar7 + 0x18;
      } while (uVar10 * 0x18 != uVar7);
    }
    local_38->mPositionKeys = paVar4;
    if (uVar9 != 0) {
      lVar12 = 0;
      pfVar6 = local_58;
      do {
        *(double *)((long)&paVar4->mTime + lVar12 * 2) = (double)(*pfVar6 * 1000.0);
        *(undefined8 *)((long)&(paVar4->mValue).x + lVar12 * 2) =
             *(undefined8 *)((long)&local_60->w + lVar12);
        *(undefined4 *)((long)&(paVar4->mValue).z + lVar12 * 2) =
             *(undefined4 *)((long)&local_60->y + lVar12);
        pfVar6 = pfVar6 + 1;
        lVar12 = lVar12 + 0xc;
      } while (uVar10 * 0xc != lVar12);
    }
    if (local_58 != (float *)0x0) {
      operator_delete__(local_58);
    }
    paVar11 = local_38;
    if (local_60 != (aiQuaterniont<float> *)0x0) {
      operator_delete__(local_60);
    }
  }
  pSVar2 = samplers->rotation;
  if (pSVar2 == (Sampler *)0x0) {
    if ((node->rotation).isPresent == true) {
      paVar11->mNumRotationKeys = 1;
      paVar5 = (aiQuatKey *)operator_new__(0x18);
      paVar5->mTime = 0.0;
      (paVar5->mValue).w = 1.0;
      (paVar5->mValue).x = 0.0;
      (paVar5->mValue).y = 0.0;
      (paVar5->mValue).z = 0.0;
      paVar11->mRotationKeys = paVar5;
      paVar5->mTime = 0.0;
      (paVar5->mValue).x = (node->rotation).value[0];
      (paVar5->mValue).y = (node->rotation).value[1];
      (paVar5->mValue).z = (node->rotation).value[2];
      (paVar5->mValue).w = (node->rotation).value[3];
    }
  }
  else {
    local_58 = (float *)0x0;
    glTF2::Accessor::ExtractData<float>
              ((((pSVar2->input).vector)->
               super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>)._M_impl.
               super__Vector_impl_data._M_start[(pSVar2->input).index],&local_58);
    local_60 = (aiQuaterniont<float> *)0x0;
    glTF2::Accessor::ExtractData<aiQuaterniont<float>>
              ((((samplers->rotation->output).vector)->
               super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>)._M_impl.
               super__Vector_impl_data._M_start[(samplers->rotation->output).index],&local_60);
    uVar10 = (((samplers->rotation->input).vector)->
             super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>)._M_impl.
             super__Vector_impl_data._M_start[(samplers->rotation->input).index]->count;
    uVar7 = uVar10 & 0xffffffff;
    paVar11->mNumRotationKeys = (uint)uVar10;
    paVar5 = (aiQuatKey *)operator_new__(uVar7 * 0x18);
    if (uVar7 != 0) {
      paVar8 = paVar5;
      do {
        paVar8->mTime = 0.0;
        (paVar8->mValue).w = 1.0;
        (paVar8->mValue).x = 0.0;
        (paVar8->mValue).y = 0.0;
        (paVar8->mValue).z = 0.0;
        paVar8 = paVar8 + 1;
      } while (paVar8 != paVar5 + uVar7);
    }
    paVar11->mRotationKeys = paVar5;
    uVar9 = paVar11->mNumRotationKeys;
    if ((ulong)uVar9 != 0) {
      pfVar6 = &(paVar5->mValue).z;
      lVar12 = 0;
      do {
        *(double *)(pfVar6 + -5) = (double)(*(float *)((long)local_58 + lVar12) * 1000.0);
        pfVar6[-2] = (&local_60->w)[lVar12];
        pfVar6[-1] = (&local_60->x)[lVar12];
        *pfVar6 = (&local_60->y)[lVar12];
        ((aiQuaternion *)(pfVar6 + -3))->w = (&local_60->z)[lVar12];
        lVar12 = lVar12 + 4;
        pfVar6 = pfVar6 + 6;
      } while ((ulong)uVar9 << 2 != lVar12);
    }
    if (local_58 != (float *)0x0) {
      operator_delete__(local_58);
    }
    if (local_60 != (aiQuaterniont<float> *)0x0) {
      operator_delete__(local_60);
    }
  }
  pSVar2 = samplers->scale;
  if (pSVar2 == (Sampler *)0x0) {
    if ((node->scale).isPresent == true) {
      paVar11->mNumScalingKeys = 1;
      paVar4 = (aiVectorKey *)operator_new__(0x18);
      paVar4->mTime = 0.0;
      (paVar4->mValue).x = 0.0;
      (paVar4->mValue).y = 0.0;
      (paVar4->mValue).z = 0.0;
      paVar11->mScalingKeys = paVar4;
      paVar4->mTime = 0.0;
      (paVar4->mValue).x = (node->scale).value[0];
      (paVar4->mValue).y = (node->scale).value[1];
      (paVar4->mValue).z = (node->scale).value[2];
    }
  }
  else {
    local_58 = (float *)0x0;
    glTF2::Accessor::ExtractData<float>
              ((((pSVar2->input).vector)->
               super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>)._M_impl.
               super__Vector_impl_data._M_start[(pSVar2->input).index],&local_58);
    local_60 = (aiQuaterniont<float> *)0x0;
    glTF2::Accessor::ExtractData<aiVector3t<float>>
              ((((samplers->scale->output).vector)->
               super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>)._M_impl.
               super__Vector_impl_data._M_start[(samplers->scale->output).index],
               (aiVector3t<float> **)&local_60);
    uVar10 = (((samplers->scale->input).vector)->
             super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>)._M_impl.
             super__Vector_impl_data._M_start[(samplers->scale->input).index]->count;
    uVar9 = (uint)uVar10;
    uVar10 = uVar10 & 0xffffffff;
    paVar11->mNumScalingKeys = uVar9;
    paVar4 = (aiVectorKey *)operator_new__(uVar10 * 0x18);
    if (uVar10 != 0) {
      uVar7 = 0;
      do {
        puVar1 = (undefined8 *)((long)&paVar4->mTime + uVar7);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined4 *)((long)&(paVar4->mValue).z + uVar7) = 0;
        uVar7 = uVar7 + 0x18;
      } while (uVar10 * 0x18 != uVar7);
    }
    paVar3->mScalingKeys = paVar4;
    if (uVar9 != 0) {
      lVar12 = 0;
      pfVar6 = local_58;
      do {
        *(double *)((long)&paVar4->mTime + lVar12 * 2) = (double)(*pfVar6 * 1000.0);
        *(undefined8 *)((long)&(paVar4->mValue).x + lVar12 * 2) =
             *(undefined8 *)((long)&local_60->w + lVar12);
        *(undefined4 *)((long)&(paVar4->mValue).z + lVar12 * 2) =
             *(undefined4 *)((long)&local_60->y + lVar12);
        pfVar6 = pfVar6 + 1;
        lVar12 = lVar12 + 0xc;
      } while (uVar10 * 0xc != lVar12);
    }
    if (local_58 != (float *)0x0) {
      operator_delete__(local_58);
    }
    if (local_60 != (aiQuaterniont<float> *)0x0) {
      operator_delete__(local_60);
    }
  }
  return paVar11;
}

Assistant:

aiNodeAnim* CreateNodeAnim(glTF2::Asset& r, Node& node, AnimationSamplers& samplers)
{
    aiNodeAnim* anim = new aiNodeAnim();
    anim->mNodeName = GetNodeName(node);

    static const float kMillisecondsFromSeconds = 1000.f;

    if (samplers.translation) {
        float* times = nullptr;
        samplers.translation->input->ExtractData(times);
        aiVector3D* values = nullptr;
        samplers.translation->output->ExtractData(values);
        anim->mNumPositionKeys = static_cast<uint32_t>(samplers.translation->input->count);
        anim->mPositionKeys = new aiVectorKey[anim->mNumPositionKeys];
        for (unsigned int i = 0; i < anim->mNumPositionKeys; ++i) {
            anim->mPositionKeys[i].mTime = times[i] * kMillisecondsFromSeconds;
            anim->mPositionKeys[i].mValue = values[i];
        }
        delete[] times;
        delete[] values;
    } else if (node.translation.isPresent) {
        anim->mNumPositionKeys = 1;
        anim->mPositionKeys = new aiVectorKey[anim->mNumPositionKeys];
        anim->mPositionKeys->mTime = 0.f;
        anim->mPositionKeys->mValue.x = node.translation.value[0];
        anim->mPositionKeys->mValue.y = node.translation.value[1];
        anim->mPositionKeys->mValue.z = node.translation.value[2];
    }

    if (samplers.rotation) {
        float* times = nullptr;
        samplers.rotation->input->ExtractData(times);
        aiQuaternion* values = nullptr;
        samplers.rotation->output->ExtractData(values);
        anim->mNumRotationKeys = static_cast<uint32_t>(samplers.rotation->input->count);
        anim->mRotationKeys = new aiQuatKey[anim->mNumRotationKeys];
        for (unsigned int i = 0; i < anim->mNumRotationKeys; ++i) {
            anim->mRotationKeys[i].mTime = times[i] * kMillisecondsFromSeconds;
            anim->mRotationKeys[i].mValue.x = values[i].w;
            anim->mRotationKeys[i].mValue.y = values[i].x;
            anim->mRotationKeys[i].mValue.z = values[i].y;
            anim->mRotationKeys[i].mValue.w = values[i].z;
        }
        delete[] times;
        delete[] values;
    } else if (node.rotation.isPresent) {
        anim->mNumRotationKeys = 1;
        anim->mRotationKeys = new aiQuatKey[anim->mNumRotationKeys];
        anim->mRotationKeys->mTime = 0.f;
        anim->mRotationKeys->mValue.x = node.rotation.value[0];
        anim->mRotationKeys->mValue.y = node.rotation.value[1];
        anim->mRotationKeys->mValue.z = node.rotation.value[2];
        anim->mRotationKeys->mValue.w = node.rotation.value[3];
    }

    if (samplers.scale) {
        float* times = nullptr;
        samplers.scale->input->ExtractData(times);
        aiVector3D* values = nullptr;
        samplers.scale->output->ExtractData(values);
        anim->mNumScalingKeys = static_cast<uint32_t>(samplers.scale->input->count);
        anim->mScalingKeys = new aiVectorKey[anim->mNumScalingKeys];
        for (unsigned int i = 0; i < anim->mNumScalingKeys; ++i) {
            anim->mScalingKeys[i].mTime = times[i] * kMillisecondsFromSeconds;
            anim->mScalingKeys[i].mValue = values[i];
        }
        delete[] times;
        delete[] values;
    } else if (node.scale.isPresent) {
        anim->mNumScalingKeys = 1;
        anim->mScalingKeys = new aiVectorKey[anim->mNumScalingKeys];
        anim->mScalingKeys->mTime = 0.f;
        anim->mScalingKeys->mValue.x = node.scale.value[0];
        anim->mScalingKeys->mValue.y = node.scale.value[1];
        anim->mScalingKeys->mValue.z = node.scale.value[2];
    }

    return anim;
}